

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicExtensionTest_Test::TestBody
          (MessageDifferencerTest_BasicExtensionTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  undefined1 local_70 [8];
  TestAllExtensions msg2;
  TestAllExtensions msg1;
  MessageDifferencerTest_BasicExtensionTest_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_70);
  local_91 = util::MessageDifferencer::Equals
                       ((Message *)&msg2.field_0._impl_._cached_size_,(Message *)local_70);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,
               (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x49d,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicExtensionTest) {
  // Create the testing protos
  unittest::TestAllExtensions msg1;
  unittest::TestAllExtensions msg2;

  TestUtil::SetAllExtensions(&msg1);
  TestUtil::SetAllExtensions(&msg2);

  // Compare
  EXPECT_TRUE(util::MessageDifferencer::Equals(msg1, msg2));
}